

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QCss::BasicSelector>::copyAppend
          (QGenericArrayOps<QCss::BasicSelector> *this,BasicSelector *b,BasicSelector *e)

{
  BasicSelector *this_00;
  ulong in_RDX;
  ulong in_RSI;
  BasicSelector *in_RDI;
  BasicSelector *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QCss::BasicSelector>::begin
                        ((QArrayDataPointer<QCss::BasicSelector> *)0x485697);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QCss::BasicSelector::BasicSelector(this_00,in_RDI);
      local_10 = local_10 + 0x68;
      (in_RDI->elementName).d.size = (in_RDI->elementName).d.size + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }